

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderFrameBorder(ImVec2 p_min,ImVec2 p_max,float rounding)

{
  float thickness;
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ImU32 IVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar10 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar11 [64];
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec4 local_58;
  ImVec2 local_40;
  ImVec2 local_38;
  
  auVar11._8_56_ = in_register_00001248;
  auVar11._0_8_ = p_max;
  auVar10._8_56_ = in_register_00001208;
  auVar10._0_8_ = p_min;
  local_60 = (ImVec2)vmovlps_avx(auVar10._0_16_);
  local_68 = (ImVec2)vmovlps_avx(auVar11._0_16_);
  thickness = (GImGui->Style).FrameBorderSize;
  if (0.0 < thickness) {
    pIVar1 = GImGui->CurrentWindow;
    pIVar2 = pIVar1->DrawList;
    auVar8._0_4_ = p_min.x + 1.0;
    auVar8._4_4_ = p_min.y + 1.0;
    auVar8._8_4_ = in_register_00001208._0_4_ + 1.0;
    auVar8._12_4_ = in_register_00001208._4_4_ + 1.0;
    local_38 = (ImVec2)vmovlps_avx(auVar8);
    auVar9._0_4_ = p_max.x + 1.0;
    auVar9._4_4_ = p_max.y + 1.0;
    auVar9._8_4_ = in_register_00001248._0_4_ + 1.0;
    auVar9._12_4_ = in_register_00001248._4_4_ + 1.0;
    local_40 = (ImVec2)vmovlps_avx(auVar9);
    local_58.x = (GImGui->Style).Colors[6].x;
    local_58.y = (GImGui->Style).Colors[6].y;
    uVar3 = (GImGui->Style).Colors[6].z;
    uVar4 = (GImGui->Style).Colors[6].w;
    local_58.w = (GImGui->Style).Alpha * (float)uVar4;
    local_58.z = (float)uVar3;
    IVar7 = ColorConvertFloat4ToU32(&local_58);
    ImDrawList::AddRect(pIVar2,&local_38,&local_40,IVar7,rounding,0xf,thickness);
    pIVar2 = pIVar1->DrawList;
    local_58.x = (GImGui->Style).Colors[5].x;
    local_58.y = (GImGui->Style).Colors[5].y;
    uVar5 = (GImGui->Style).Colors[5].z;
    uVar6 = (GImGui->Style).Colors[5].w;
    local_58.w = (GImGui->Style).Alpha * (float)uVar6;
    local_58.z = (float)uVar5;
    IVar7 = ColorConvertFloat4ToU32(&local_58);
    ImDrawList::AddRect(pIVar2,&local_60,&local_68,IVar7,rounding,0xf,thickness);
  }
  return;
}

Assistant:

void ImGui::RenderFrameBorder(ImVec2 p_min, ImVec2 p_max, float rounding)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const float border_size = g.Style.FrameBorderSize;
    if (border_size > 0.0f)
    {
        window->DrawList->AddRect(p_min + ImVec2(1, 1), p_max + ImVec2(1, 1), GetColorU32(ImGuiCol_BorderShadow), rounding, ImDrawCornerFlags_All, border_size);
        window->DrawList->AddRect(p_min, p_max, GetColorU32(ImGuiCol_Border), rounding, ImDrawCornerFlags_All, border_size);
    }
}